

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

ptr<resp_appendix> nuraft::resp_appendix::deserialize(buffer *buf)

{
  uint8_t uVar1;
  extra_order eVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<resp_appendix> pVar5;
  uint8_t cur_ver;
  buffer_serializer bs;
  ptr<resp_appendix> *res;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  buffer_serializer local_28;
  
  buffer_serializer::buffer_serializer(&local_28,in_RSI,LITTLE);
  cs_new<nuraft::resp_appendix>();
  uVar1 = buffer_serializer::get_u8
                    ((buffer_serializer *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  _Var4._M_pi = extraout_RDX;
  if (uVar1 == '\0') {
    eVar2 = buffer_serializer::get_u8
                      ((buffer_serializer *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    peVar3 = std::
             __shared_ptr_access<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x183335);
    peVar3->extra_order_ = eVar2;
    _Var4._M_pi = extraout_RDX_00;
  }
  pVar5.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  pVar5.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_appendix>)
         pVar5.super___shared_ptr<nuraft::resp_appendix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<resp_appendix> deserialize(buffer& buf) {
        buffer_serializer bs(buf);
        ptr<resp_appendix> res = cs_new<resp_appendix>();

        uint8_t cur_ver = bs.get_u8();
        if (cur_ver != 0) {
            // Not supported version.
            return res;
        }

        res->extra_order_ = static_cast<extra_order>(bs.get_u8());
        return res;
    }